

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

void ApiDumpCleanUpMapsForTable(XrGeneratedDispatchTable *table)

{
  eraseAllTableMapElements<std::unordered_map<XrInstance_T*,XrGeneratedDispatchTable*,std::hash<XrInstance_T*>,std::equal_to<XrInstance_T*>,std::allocator<std::pair<XrInstance_T*const,XrGeneratedDispatchTable*>>>>
            (&g_instance_dispatch_map,&g_instance_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrSession_T*,XrGeneratedDispatchTable*,std::hash<XrSession_T*>,std::equal_to<XrSession_T*>,std::allocator<std::pair<XrSession_T*const,XrGeneratedDispatchTable*>>>>
            (&g_session_dispatch_map,&g_session_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrSpace_T*,XrGeneratedDispatchTable*,std::hash<XrSpace_T*>,std::equal_to<XrSpace_T*>,std::allocator<std::pair<XrSpace_T*const,XrGeneratedDispatchTable*>>>>
            (&g_space_dispatch_map,&g_space_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrAction_T*,XrGeneratedDispatchTable*,std::hash<XrAction_T*>,std::equal_to<XrAction_T*>,std::allocator<std::pair<XrAction_T*const,XrGeneratedDispatchTable*>>>>
            (&g_action_dispatch_map,&g_action_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrSwapchain_T*,XrGeneratedDispatchTable*,std::hash<XrSwapchain_T*>,std::equal_to<XrSwapchain_T*>,std::allocator<std::pair<XrSwapchain_T*const,XrGeneratedDispatchTable*>>>>
            (&g_swapchain_dispatch_map,&g_swapchain_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrActionSet_T*,XrGeneratedDispatchTable*,std::hash<XrActionSet_T*>,std::equal_to<XrActionSet_T*>,std::allocator<std::pair<XrActionSet_T*const,XrGeneratedDispatchTable*>>>>
            (&g_actionset_dispatch_map,&g_actionset_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrDebugUtilsMessengerEXT_T*,XrGeneratedDispatchTable*,std::hash<XrDebugUtilsMessengerEXT_T*>,std::equal_to<XrDebugUtilsMessengerEXT_T*>,std::allocator<std::pair<XrDebugUtilsMessengerEXT_T*const,XrGeneratedDispatchTable*>>>>
            (&g_debugutilsmessengerext_dispatch_map,&g_debugutilsmessengerext_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrSpatialAnchorMSFT_T*,XrGeneratedDispatchTable*,std::hash<XrSpatialAnchorMSFT_T*>,std::equal_to<XrSpatialAnchorMSFT_T*>,std::allocator<std::pair<XrSpatialAnchorMSFT_T*const,XrGeneratedDispatchTable*>>>>
            (&g_spatialanchormsft_dispatch_map,&g_spatialanchormsft_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrSpatialGraphNodeBindingMSFT_T*,XrGeneratedDispatchTable*,std::hash<XrSpatialGraphNodeBindingMSFT_T*>,std::equal_to<XrSpatialGraphNodeBindingMSFT_T*>,std::allocator<std::pair<XrSpatialGraphNodeBindingMSFT_T*const,XrGeneratedDispatchTable*>>>>
            (&g_spatialgraphnodebindingmsft_dispatch_map,
             &g_spatialgraphnodebindingmsft_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrHandTrackerEXT_T*,XrGeneratedDispatchTable*,std::hash<XrHandTrackerEXT_T*>,std::equal_to<XrHandTrackerEXT_T*>,std::allocator<std::pair<XrHandTrackerEXT_T*const,XrGeneratedDispatchTable*>>>>
            (&g_handtrackerext_dispatch_map,&g_handtrackerext_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrBodyTrackerFB_T*,XrGeneratedDispatchTable*,std::hash<XrBodyTrackerFB_T*>,std::equal_to<XrBodyTrackerFB_T*>,std::allocator<std::pair<XrBodyTrackerFB_T*const,XrGeneratedDispatchTable*>>>>
            (&g_bodytrackerfb_dispatch_map,&g_bodytrackerfb_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrSceneObserverMSFT_T*,XrGeneratedDispatchTable*,std::hash<XrSceneObserverMSFT_T*>,std::equal_to<XrSceneObserverMSFT_T*>,std::allocator<std::pair<XrSceneObserverMSFT_T*const,XrGeneratedDispatchTable*>>>>
            (&g_sceneobservermsft_dispatch_map,&g_sceneobservermsft_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrSceneMSFT_T*,XrGeneratedDispatchTable*,std::hash<XrSceneMSFT_T*>,std::equal_to<XrSceneMSFT_T*>,std::allocator<std::pair<XrSceneMSFT_T*const,XrGeneratedDispatchTable*>>>>
            (&g_scenemsft_dispatch_map,&g_scenemsft_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrFacialTrackerHTC_T*,XrGeneratedDispatchTable*,std::hash<XrFacialTrackerHTC_T*>,std::equal_to<XrFacialTrackerHTC_T*>,std::allocator<std::pair<XrFacialTrackerHTC_T*const,XrGeneratedDispatchTable*>>>>
            (&g_facialtrackerhtc_dispatch_map,&g_facialtrackerhtc_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrFoveationProfileFB_T*,XrGeneratedDispatchTable*,std::hash<XrFoveationProfileFB_T*>,std::equal_to<XrFoveationProfileFB_T*>,std::allocator<std::pair<XrFoveationProfileFB_T*const,XrGeneratedDispatchTable*>>>>
            (&g_foveationprofilefb_dispatch_map,&g_foveationprofilefb_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrTriangleMeshFB_T*,XrGeneratedDispatchTable*,std::hash<XrTriangleMeshFB_T*>,std::equal_to<XrTriangleMeshFB_T*>,std::allocator<std::pair<XrTriangleMeshFB_T*const,XrGeneratedDispatchTable*>>>>
            (&g_trianglemeshfb_dispatch_map,&g_trianglemeshfb_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrPassthroughFB_T*,XrGeneratedDispatchTable*,std::hash<XrPassthroughFB_T*>,std::equal_to<XrPassthroughFB_T*>,std::allocator<std::pair<XrPassthroughFB_T*const,XrGeneratedDispatchTable*>>>>
            (&g_passthroughfb_dispatch_map,&g_passthroughfb_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrPassthroughLayerFB_T*,XrGeneratedDispatchTable*,std::hash<XrPassthroughLayerFB_T*>,std::equal_to<XrPassthroughLayerFB_T*>,std::allocator<std::pair<XrPassthroughLayerFB_T*const,XrGeneratedDispatchTable*>>>>
            (&g_passthroughlayerfb_dispatch_map,&g_passthroughlayerfb_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrGeometryInstanceFB_T*,XrGeneratedDispatchTable*,std::hash<XrGeometryInstanceFB_T*>,std::equal_to<XrGeometryInstanceFB_T*>,std::allocator<std::pair<XrGeometryInstanceFB_T*const,XrGeneratedDispatchTable*>>>>
            (&g_geometryinstancefb_dispatch_map,&g_geometryinstancefb_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrMarkerDetectorML_T*,XrGeneratedDispatchTable*,std::hash<XrMarkerDetectorML_T*>,std::equal_to<XrMarkerDetectorML_T*>,std::allocator<std::pair<XrMarkerDetectorML_T*const,XrGeneratedDispatchTable*>>>>
            (&g_markerdetectorml_dispatch_map,&g_markerdetectorml_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrExportedLocalizationMapML_T*,XrGeneratedDispatchTable*,std::hash<XrExportedLocalizationMapML_T*>,std::equal_to<XrExportedLocalizationMapML_T*>,std::allocator<std::pair<XrExportedLocalizationMapML_T*const,XrGeneratedDispatchTable*>>>>
            (&g_exportedlocalizationmapml_dispatch_map,&g_exportedlocalizationmapml_dispatch_mutex,
             table);
  eraseAllTableMapElements<std::unordered_map<XrSpatialAnchorsStorageML_T*,XrGeneratedDispatchTable*,std::hash<XrSpatialAnchorsStorageML_T*>,std::equal_to<XrSpatialAnchorsStorageML_T*>,std::allocator<std::pair<XrSpatialAnchorsStorageML_T*const,XrGeneratedDispatchTable*>>>>
            (&g_spatialanchorsstorageml_dispatch_map,&g_spatialanchorsstorageml_dispatch_mutex,table
            );
  eraseAllTableMapElements<std::unordered_map<XrSpatialAnchorStoreConnectionMSFT_T*,XrGeneratedDispatchTable*,std::hash<XrSpatialAnchorStoreConnectionMSFT_T*>,std::equal_to<XrSpatialAnchorStoreConnectionMSFT_T*>,std::allocator<std::pair<XrSpatialAnchorStoreConnectionMSFT_T*const,XrGeneratedDispatchTable*>>>>
            (&g_spatialanchorstoreconnectionmsft_dispatch_map,
             &g_spatialanchorstoreconnectionmsft_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrSpaceUserFB_T*,XrGeneratedDispatchTable*,std::hash<XrSpaceUserFB_T*>,std::equal_to<XrSpaceUserFB_T*>,std::allocator<std::pair<XrSpaceUserFB_T*const,XrGeneratedDispatchTable*>>>>
            (&g_spaceuserfb_dispatch_map,&g_spaceuserfb_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrFaceTrackerFB_T*,XrGeneratedDispatchTable*,std::hash<XrFaceTrackerFB_T*>,std::equal_to<XrFaceTrackerFB_T*>,std::allocator<std::pair<XrFaceTrackerFB_T*const,XrGeneratedDispatchTable*>>>>
            (&g_facetrackerfb_dispatch_map,&g_facetrackerfb_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrEyeTrackerFB_T*,XrGeneratedDispatchTable*,std::hash<XrEyeTrackerFB_T*>,std::equal_to<XrEyeTrackerFB_T*>,std::allocator<std::pair<XrEyeTrackerFB_T*const,XrGeneratedDispatchTable*>>>>
            (&g_eyetrackerfb_dispatch_map,&g_eyetrackerfb_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrVirtualKeyboardMETA_T*,XrGeneratedDispatchTable*,std::hash<XrVirtualKeyboardMETA_T*>,std::equal_to<XrVirtualKeyboardMETA_T*>,std::allocator<std::pair<XrVirtualKeyboardMETA_T*const,XrGeneratedDispatchTable*>>>>
            (&g_virtualkeyboardmeta_dispatch_map,&g_virtualkeyboardmeta_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrPassthroughColorLutMETA_T*,XrGeneratedDispatchTable*,std::hash<XrPassthroughColorLutMETA_T*>,std::equal_to<XrPassthroughColorLutMETA_T*>,std::allocator<std::pair<XrPassthroughColorLutMETA_T*const,XrGeneratedDispatchTable*>>>>
            (&g_passthroughcolorlutmeta_dispatch_map,&g_passthroughcolorlutmeta_dispatch_mutex,table
            );
  eraseAllTableMapElements<std::unordered_map<XrFaceTracker2FB_T*,XrGeneratedDispatchTable*,std::hash<XrFaceTracker2FB_T*>,std::equal_to<XrFaceTracker2FB_T*>,std::allocator<std::pair<XrFaceTracker2FB_T*const,XrGeneratedDispatchTable*>>>>
            (&g_facetracker2fb_dispatch_map,&g_facetracker2fb_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrEnvironmentDepthProviderMETA_T*,XrGeneratedDispatchTable*,std::hash<XrEnvironmentDepthProviderMETA_T*>,std::equal_to<XrEnvironmentDepthProviderMETA_T*>,std::allocator<std::pair<XrEnvironmentDepthProviderMETA_T*const,XrGeneratedDispatchTable*>>>>
            (&g_environmentdepthprovidermeta_dispatch_map,
             &g_environmentdepthprovidermeta_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrEnvironmentDepthSwapchainMETA_T*,XrGeneratedDispatchTable*,std::hash<XrEnvironmentDepthSwapchainMETA_T*>,std::equal_to<XrEnvironmentDepthSwapchainMETA_T*>,std::allocator<std::pair<XrEnvironmentDepthSwapchainMETA_T*const,XrGeneratedDispatchTable*>>>>
            (&g_environmentdepthswapchainmeta_dispatch_map,
             &g_environmentdepthswapchainmeta_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrPassthroughHTC_T*,XrGeneratedDispatchTable*,std::hash<XrPassthroughHTC_T*>,std::equal_to<XrPassthroughHTC_T*>,std::allocator<std::pair<XrPassthroughHTC_T*const,XrGeneratedDispatchTable*>>>>
            (&g_passthroughhtc_dispatch_map,&g_passthroughhtc_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrBodyTrackerHTC_T*,XrGeneratedDispatchTable*,std::hash<XrBodyTrackerHTC_T*>,std::equal_to<XrBodyTrackerHTC_T*>,std::allocator<std::pair<XrBodyTrackerHTC_T*const,XrGeneratedDispatchTable*>>>>
            (&g_bodytrackerhtc_dispatch_map,&g_bodytrackerhtc_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrBodyTrackerBD_T*,XrGeneratedDispatchTable*,std::hash<XrBodyTrackerBD_T*>,std::equal_to<XrBodyTrackerBD_T*>,std::allocator<std::pair<XrBodyTrackerBD_T*const,XrGeneratedDispatchTable*>>>>
            (&g_bodytrackerbd_dispatch_map,&g_bodytrackerbd_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrSenseDataProviderBD_T*,XrGeneratedDispatchTable*,std::hash<XrSenseDataProviderBD_T*>,std::equal_to<XrSenseDataProviderBD_T*>,std::allocator<std::pair<XrSenseDataProviderBD_T*const,XrGeneratedDispatchTable*>>>>
            (&g_sensedataproviderbd_dispatch_map,&g_sensedataproviderbd_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrSenseDataSnapshotBD_T*,XrGeneratedDispatchTable*,std::hash<XrSenseDataSnapshotBD_T*>,std::equal_to<XrSenseDataSnapshotBD_T*>,std::allocator<std::pair<XrSenseDataSnapshotBD_T*const,XrGeneratedDispatchTable*>>>>
            (&g_sensedatasnapshotbd_dispatch_map,&g_sensedatasnapshotbd_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrAnchorBD_T*,XrGeneratedDispatchTable*,std::hash<XrAnchorBD_T*>,std::equal_to<XrAnchorBD_T*>,std::allocator<std::pair<XrAnchorBD_T*const,XrGeneratedDispatchTable*>>>>
            (&g_anchorbd_dispatch_map,&g_anchorbd_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrPlaneDetectorEXT_T*,XrGeneratedDispatchTable*,std::hash<XrPlaneDetectorEXT_T*>,std::equal_to<XrPlaneDetectorEXT_T*>,std::allocator<std::pair<XrPlaneDetectorEXT_T*const,XrGeneratedDispatchTable*>>>>
            (&g_planedetectorext_dispatch_map,&g_planedetectorext_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrWorldMeshDetectorML_T*,XrGeneratedDispatchTable*,std::hash<XrWorldMeshDetectorML_T*>,std::equal_to<XrWorldMeshDetectorML_T*>,std::allocator<std::pair<XrWorldMeshDetectorML_T*const,XrGeneratedDispatchTable*>>>>
            (&g_worldmeshdetectorml_dispatch_map,&g_worldmeshdetectorml_dispatch_mutex,table);
  eraseAllTableMapElements<std::unordered_map<XrFacialExpressionClientML_T*,XrGeneratedDispatchTable*,std::hash<XrFacialExpressionClientML_T*>,std::equal_to<XrFacialExpressionClientML_T*>,std::allocator<std::pair<XrFacialExpressionClientML_T*const,XrGeneratedDispatchTable*>>>>
            (&g_facialexpressionclientml_dispatch_map,&g_facialexpressionclientml_dispatch_mutex,
             table);
  return;
}

Assistant:

void ApiDumpCleanUpMapsForTable(XrGeneratedDispatchTable *table) {
    eraseAllTableMapElements<std::unordered_map<XrInstance, XrGeneratedDispatchTable*>>(g_instance_dispatch_map, g_instance_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSession, XrGeneratedDispatchTable*>>(g_session_dispatch_map, g_session_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSpace, XrGeneratedDispatchTable*>>(g_space_dispatch_map, g_space_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrAction, XrGeneratedDispatchTable*>>(g_action_dispatch_map, g_action_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSwapchain, XrGeneratedDispatchTable*>>(g_swapchain_dispatch_map, g_swapchain_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrActionSet, XrGeneratedDispatchTable*>>(g_actionset_dispatch_map, g_actionset_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrDebugUtilsMessengerEXT, XrGeneratedDispatchTable*>>(g_debugutilsmessengerext_dispatch_map, g_debugutilsmessengerext_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSpatialAnchorMSFT, XrGeneratedDispatchTable*>>(g_spatialanchormsft_dispatch_map, g_spatialanchormsft_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSpatialGraphNodeBindingMSFT, XrGeneratedDispatchTable*>>(g_spatialgraphnodebindingmsft_dispatch_map, g_spatialgraphnodebindingmsft_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrHandTrackerEXT, XrGeneratedDispatchTable*>>(g_handtrackerext_dispatch_map, g_handtrackerext_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrBodyTrackerFB, XrGeneratedDispatchTable*>>(g_bodytrackerfb_dispatch_map, g_bodytrackerfb_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSceneObserverMSFT, XrGeneratedDispatchTable*>>(g_sceneobservermsft_dispatch_map, g_sceneobservermsft_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSceneMSFT, XrGeneratedDispatchTable*>>(g_scenemsft_dispatch_map, g_scenemsft_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrFacialTrackerHTC, XrGeneratedDispatchTable*>>(g_facialtrackerhtc_dispatch_map, g_facialtrackerhtc_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrFoveationProfileFB, XrGeneratedDispatchTable*>>(g_foveationprofilefb_dispatch_map, g_foveationprofilefb_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrTriangleMeshFB, XrGeneratedDispatchTable*>>(g_trianglemeshfb_dispatch_map, g_trianglemeshfb_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrPassthroughFB, XrGeneratedDispatchTable*>>(g_passthroughfb_dispatch_map, g_passthroughfb_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrPassthroughLayerFB, XrGeneratedDispatchTable*>>(g_passthroughlayerfb_dispatch_map, g_passthroughlayerfb_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrGeometryInstanceFB, XrGeneratedDispatchTable*>>(g_geometryinstancefb_dispatch_map, g_geometryinstancefb_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrMarkerDetectorML, XrGeneratedDispatchTable*>>(g_markerdetectorml_dispatch_map, g_markerdetectorml_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrExportedLocalizationMapML, XrGeneratedDispatchTable*>>(g_exportedlocalizationmapml_dispatch_map, g_exportedlocalizationmapml_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSpatialAnchorsStorageML, XrGeneratedDispatchTable*>>(g_spatialanchorsstorageml_dispatch_map, g_spatialanchorsstorageml_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSpatialAnchorStoreConnectionMSFT, XrGeneratedDispatchTable*>>(g_spatialanchorstoreconnectionmsft_dispatch_map, g_spatialanchorstoreconnectionmsft_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSpaceUserFB, XrGeneratedDispatchTable*>>(g_spaceuserfb_dispatch_map, g_spaceuserfb_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrFaceTrackerFB, XrGeneratedDispatchTable*>>(g_facetrackerfb_dispatch_map, g_facetrackerfb_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrEyeTrackerFB, XrGeneratedDispatchTable*>>(g_eyetrackerfb_dispatch_map, g_eyetrackerfb_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrVirtualKeyboardMETA, XrGeneratedDispatchTable*>>(g_virtualkeyboardmeta_dispatch_map, g_virtualkeyboardmeta_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrPassthroughColorLutMETA, XrGeneratedDispatchTable*>>(g_passthroughcolorlutmeta_dispatch_map, g_passthroughcolorlutmeta_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrFaceTracker2FB, XrGeneratedDispatchTable*>>(g_facetracker2fb_dispatch_map, g_facetracker2fb_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrEnvironmentDepthProviderMETA, XrGeneratedDispatchTable*>>(g_environmentdepthprovidermeta_dispatch_map, g_environmentdepthprovidermeta_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrEnvironmentDepthSwapchainMETA, XrGeneratedDispatchTable*>>(g_environmentdepthswapchainmeta_dispatch_map, g_environmentdepthswapchainmeta_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrPassthroughHTC, XrGeneratedDispatchTable*>>(g_passthroughhtc_dispatch_map, g_passthroughhtc_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrBodyTrackerHTC, XrGeneratedDispatchTable*>>(g_bodytrackerhtc_dispatch_map, g_bodytrackerhtc_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrBodyTrackerBD, XrGeneratedDispatchTable*>>(g_bodytrackerbd_dispatch_map, g_bodytrackerbd_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSenseDataProviderBD, XrGeneratedDispatchTable*>>(g_sensedataproviderbd_dispatch_map, g_sensedataproviderbd_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrSenseDataSnapshotBD, XrGeneratedDispatchTable*>>(g_sensedatasnapshotbd_dispatch_map, g_sensedatasnapshotbd_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrAnchorBD, XrGeneratedDispatchTable*>>(g_anchorbd_dispatch_map, g_anchorbd_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrPlaneDetectorEXT, XrGeneratedDispatchTable*>>(g_planedetectorext_dispatch_map, g_planedetectorext_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrWorldMeshDetectorML, XrGeneratedDispatchTable*>>(g_worldmeshdetectorml_dispatch_map, g_worldmeshdetectorml_dispatch_mutex, table);
    eraseAllTableMapElements<std::unordered_map<XrFacialExpressionClientML, XrGeneratedDispatchTable*>>(g_facialexpressionclientml_dispatch_map, g_facialexpressionclientml_dispatch_mutex, table);
}